

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  WhereConst *pWVar1;
  Expr **ppEVar2;
  Expr *pEVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = 0;
  if ((pExpr->op == 0x9e) && (iVar4 = 0, (pExpr->flags & 8) == 0)) {
    pWVar1 = (pWalker->u).pConst;
    iVar4 = 1;
    if (0 < (long)pWVar1->nConst) {
      ppEVar2 = pWVar1->apExpr;
      lVar5 = 0;
      do {
        pEVar3 = *(Expr **)((long)ppEVar2 + lVar5);
        if (((pEVar3 != pExpr) && (pEVar3->iTable == pExpr->iTable)) &&
           (pEVar3->iColumn == pExpr->iColumn)) {
          pWVar1->nChng = pWVar1->nChng + 1;
          pExpr->flags = pExpr->flags & 0xff7ffff7 | 8;
          pEVar3 = *(Expr **)((long)ppEVar2 + lVar5 + 8);
          if (pEVar3 == (Expr *)0x0) {
            pEVar3 = (Expr *)0x0;
          }
          else {
            pEVar3 = exprDup(pWVar1->pParse->db,pEVar3,0,(u8 **)0x0);
          }
          pExpr->pLeft = pEVar3;
          return 1;
        }
        lVar5 = lVar5 + 0x10;
      } while ((long)pWVar1->nConst * 0x10 != lVar5);
    }
  }
  return iVar4;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  int i;
  WhereConst *pConst;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol) ) return WRC_Continue;
  pConst = pWalker->u.pConst;
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    break;
  }
  return WRC_Prune;
}